

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_decompose.hpp
# Opt level: O0

lest * __thiscall lest::of_type(lest *this,text *type)

{
  string local_38 [32];
  text *local_18;
  text *type_local;
  
  local_18 = type;
  type_local = (text *)this;
  std::operator+((char *)local_38,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"of type ");
  std::__cxx11::string::string((string *)this,local_38);
  std::__cxx11::string::~string(local_38);
  return this;
}

Assistant:

inline text of_type( text type )
{
    return "of type " + type;
}